

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O0

bool __thiscall xsettingsd::SettingsManager::LoadConfig(SettingsManager *this)

{
  undefined8 uVar1;
  FILE *pFVar2;
  bool bVar3;
  FileCharStream *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  Map *pMVar6;
  size_type sVar7;
  size_type sVar8;
  char *pcVar9;
  string local_a8;
  undefined1 local_88 [8];
  SettingsMap new_settings;
  undefined1 local_48 [8];
  ConfigParser parser;
  SettingsManager *this_local;
  
  parser.error_str_.field_2._8_8_ = this;
  this_00 = (FileCharStream *)operator_new(0x40);
  ConfigParser::FileCharStream::FileCharStream(this_00,&this->config_filename_);
  ConfigParser::ConfigParser((ConfigParser *)local_48,(CharStream *)this_00);
  SettingsMap::SettingsMap((SettingsMap *)local_88);
  bVar3 = ConfigParser::Parse((ConfigParser *)local_48,(SettingsMap *)local_88,&this->settings_,
                              this->serial_ + 1);
  pFVar2 = _stderr;
  uVar1 = kProgName;
  if (bVar3) {
    this->serial_ = this->serial_ + 1;
    pFVar2 = _stderr;
    uVar1 = kProgName;
    pMVar6 = SettingsMap::map_abi_cxx11_((SettingsMap *)local_88);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
            ::size(pMVar6);
    pMVar6 = SettingsMap::map_abi_cxx11_((SettingsMap *)local_88);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
            ::size(pMVar6);
    pcVar9 = "s";
    if (sVar8 == 1) {
      pcVar9 = "";
    }
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"%s: Loaded %zu setting%s from %s\n",uVar1,sVar7,pcVar9,uVar4);
    SettingsMap::swap(&this->settings_,(SettingsMap *)local_88);
    this_local._7_1_ = true;
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    ConfigParser::FormatError_abi_cxx11_(&local_a8,(ConfigParser *)local_48);
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"%s: Unable to parse %s: %s\n",uVar1,uVar4,uVar5);
    std::__cxx11::string::~string((string *)&local_a8);
    this_local._7_1_ = false;
  }
  SettingsMap::~SettingsMap((SettingsMap *)local_88);
  ConfigParser::~ConfigParser((ConfigParser *)local_48);
  return this_local._7_1_;
}

Assistant:

bool SettingsManager::LoadConfig() {
  ConfigParser parser(new ConfigParser::FileCharStream(config_filename_));
  SettingsMap new_settings;
  if (!parser.Parse(&new_settings, &settings_, serial_ + 1)) {
    fprintf(stderr, "%s: Unable to parse %s: %s\n",
            kProgName, config_filename_.c_str(), parser.FormatError().c_str());
    return false;
  }
  serial_++;
  fprintf(stderr, "%s: Loaded %zu setting%s from %s\n",
          kProgName, new_settings.map().size(),
          (new_settings.map().size() == 1) ? "" : "s",
          config_filename_.c_str());
  settings_.swap(&new_settings);
  return true;
}